

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmServer.cxx
# Opt level: O2

void __thiscall cmServer::PrintHello(cmServer *this,cmConnection *connection)

{
  pointer ppcVar1;
  int iVar2;
  Value *pVVar3;
  Int value;
  Value *pVVar4;
  cmServer *this_00;
  pointer ppcVar5;
  Value hello;
  undefined1 local_120 [80];
  Value local_d0;
  Value local_a8;
  Value local_80;
  Value tmp;
  
  Json::Value::Value(&hello,objectValue);
  Json::Value::Value((Value *)(local_120 + 0x28),"hello");
  pVVar3 = Json::Value::operator[](&hello,&kTYPE_KEY_abi_cxx11_);
  Json::Value::operator=(pVVar3,(Value *)(local_120 + 0x28));
  Json::Value::~Value((Value *)(local_120 + 0x28));
  Json::Value::Value((Value *)local_120,arrayValue);
  pVVar3 = Json::Value::operator[](&hello,&kSUPPORTED_PROTOCOL_VERSIONS_abi_cxx11_);
  pVVar3 = Json::Value::operator=(pVVar3,(Value *)local_120);
  this_00 = (cmServer *)local_120;
  Json::Value::~Value((Value *)this_00);
  ppcVar1 = (this->SupportedProtocols).
            super__Vector_base<cmServerProtocol_*,_std::allocator<cmServerProtocol_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  for (ppcVar5 = (this->SupportedProtocols).
                 super__Vector_base<cmServerProtocol_*,_std::allocator<cmServerProtocol_*>_>._M_impl
                 .super__Vector_impl_data._M_start; ppcVar5 != ppcVar1; ppcVar5 = ppcVar5 + 1) {
    iVar2 = (*(*ppcVar5)->_vptr_cmServerProtocol[2])();
    Json::Value::Value(&tmp,objectValue);
    Json::Value::Value(&local_80,iVar2);
    pVVar4 = Json::Value::operator[](&tmp,&kMAJOR_KEY_abi_cxx11_);
    Json::Value::operator=(pVVar4,&local_80);
    Json::Value::~Value(&local_80);
    Json::Value::Value(&local_a8,value);
    pVVar4 = Json::Value::operator[](&tmp,&kMINOR_KEY_abi_cxx11_);
    Json::Value::operator=(pVVar4,&local_a8);
    Json::Value::~Value(&local_a8);
    iVar2 = (*(*ppcVar5)->_vptr_cmServerProtocol[3])();
    if ((char)iVar2 != '\0') {
      Json::Value::Value(&local_d0,true);
      pVVar4 = Json::Value::operator[](&tmp,&kIS_EXPERIMENTAL_KEY_abi_cxx11_);
      Json::Value::operator=(pVVar4,&local_d0);
      Json::Value::~Value(&local_d0);
    }
    Json::Value::append(pVVar3,&tmp);
    this_00 = (cmServer *)&tmp;
    Json::Value::~Value(&tmp);
  }
  WriteJsonObject(this_00,connection,&hello,(DebugInfo *)0x0);
  Json::Value::~Value(&hello);
  return;
}

Assistant:

void cmServer::PrintHello(cmConnection* connection) const
{
  Json::Value hello = Json::objectValue;
  hello[kTYPE_KEY] = "hello";

  Json::Value& protocolVersions = hello[kSUPPORTED_PROTOCOL_VERSIONS] =
    Json::arrayValue;

  for (auto const& proto : this->SupportedProtocols) {
    auto version = proto->ProtocolVersion();
    Json::Value tmp = Json::objectValue;
    tmp[kMAJOR_KEY] = version.first;
    tmp[kMINOR_KEY] = version.second;
    if (proto->IsExperimental()) {
      tmp[kIS_EXPERIMENTAL_KEY] = true;
    }
    protocolVersions.append(tmp);
  }

  this->WriteJsonObject(connection, hello, nullptr);
}